

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Round::applyPoint
          (Interval *__return_storage_ptr__,Round *this,EvalContext *param_1,double x)

{
  double dVar1;
  double dVar2;
  Interval local_60;
  Interval local_48;
  double local_30;
  double fract;
  double truncated;
  double x_local;
  EvalContext *param_1_local;
  Round *this_local;
  
  fract = 0.0;
  truncated = x;
  x_local = (double)param_1;
  param_1_local = (EvalContext *)this;
  local_30 = deModf(x,&fract);
  tcu::Interval::Interval(__return_storage_ptr__);
  if (ABS(local_30) <= 0.5) {
    tcu::Interval::Interval(&local_48,fract);
    tcu::Interval::operator|=(__return_storage_ptr__,&local_48);
  }
  dVar1 = fract;
  if (0.5 <= ABS(local_30)) {
    dVar2 = deSign(local_30);
    tcu::Interval::Interval(&local_60,dVar1 + dVar2);
    tcu::Interval::operator|=(__return_storage_ptr__,&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	applyPoint	(const EvalContext&, double x) const
	{
		double			truncated	= 0.0;
		const double	fract		= deModf(x, &truncated);
		Interval		ret;

		if (fabs(fract) <= 0.5)
			ret |= truncated;
		if (fabs(fract) >= 0.5)
			ret |= truncated + deSign(fract);

		return ret;
	}